

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler,bool isKey)

{
  ushort uVar1;
  Stack<rapidjson::CrtAllocator> *pSVar2;
  SizeType length;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  char *pcVar7;
  byte *pbVar8;
  ulong uVar9;
  byte bVar10;
  ulong count;
  size_t escapeOffset;
  byte *pbVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> copy;
  StackStream<char> local_78;
  GenericStringStream<rapidjson::UTF8<char>_> local_68;
  GenericStringStream<rapidjson::UTF8<char>_> *local_58;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_50;
  byte local_48;
  byte bStack_47;
  byte bStack_46;
  byte bStack_45;
  byte bStack_44;
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  byte bStack_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  byte bStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  
  local_68.src_ = (*is).src_;
  local_68.src_ = local_68.src_ + 1;
  local_68.head_ = (*is).head_;
  local_78.length_ = 0;
  local_78.stack_ = (Stack<rapidjson::CrtAllocator> *)this;
  local_58 = is;
  local_50 = handler;
LAB_00141136:
  do {
    pbVar8 = (byte *)(local_68.src_ + 0xf);
    for (pbVar11 = (byte *)local_68.src_; pSVar2 = local_78.stack_,
        pbVar11 != (byte *)((ulong)pbVar8 & 0xfffffffffffffff0); pbVar11 = pbVar11 + 1) {
      bVar10 = *pbVar11;
      if (((bVar10 == 0x22) || (bVar10 == 0x5c)) || (bVar10 < 0x20)) goto LAB_00141272;
      pbVar6 = (byte *)(local_78.stack_)->stackTop_;
      if ((byte *)(local_78.stack_)->stackEnd_ == pbVar6 ||
          (long)(local_78.stack_)->stackEnd_ - (long)pbVar6 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,1);
        pbVar6 = (byte *)pSVar2->stackTop_;
      }
      pSVar2->stackTop_ = (char *)(pbVar6 + 1);
      *pbVar6 = bVar10;
      local_78.length_ = local_78.length_ + 1;
    }
    local_48 = *pbVar11;
    bStack_47 = pbVar11[1];
    bStack_46 = pbVar11[2];
    bStack_45 = pbVar11[3];
    bStack_44 = pbVar11[4];
    bStack_43 = pbVar11[5];
    bStack_42 = pbVar11[6];
    bStack_41 = pbVar11[7];
    bStack_40 = pbVar11[8];
    bStack_3f = pbVar11[9];
    bStack_3e = pbVar11[10];
    bStack_3d = pbVar11[0xb];
    bStack_3c = pbVar11[0xc];
    bStack_3b = pbVar11[0xd];
    bStack_3a = pbVar11[0xe];
    bStack_39 = pbVar11[0xf];
    while( true ) {
      pSVar2 = local_78.stack_;
      auVar12[0] = -(local_48 == 0x22);
      auVar12[1] = -(bStack_47 == 0x22);
      auVar12[2] = -(bStack_46 == 0x22);
      auVar12[3] = -(bStack_45 == 0x22);
      auVar12[4] = -(bStack_44 == 0x22);
      auVar12[5] = -(bStack_43 == 0x22);
      auVar12[6] = -(bStack_42 == 0x22);
      auVar12[7] = -(bStack_41 == 0x22);
      auVar12[8] = -(bStack_40 == 0x22);
      auVar12[9] = -(bStack_3f == 0x22);
      auVar12[10] = -(bStack_3e == 0x22);
      auVar12[0xb] = -(bStack_3d == 0x22);
      auVar12[0xc] = -(bStack_3c == 0x22);
      auVar12[0xd] = -(bStack_3b == 0x22);
      auVar12[0xe] = -(bStack_3a == 0x22);
      auVar12[0xf] = -(bStack_39 == 0x22);
      auVar14[0] = -(local_48 == 0x5c);
      auVar14[1] = -(bStack_47 == 0x5c);
      auVar14[2] = -(bStack_46 == 0x5c);
      auVar14[3] = -(bStack_45 == 0x5c);
      auVar14[4] = -(bStack_44 == 0x5c);
      auVar14[5] = -(bStack_43 == 0x5c);
      auVar14[6] = -(bStack_42 == 0x5c);
      auVar14[7] = -(bStack_41 == 0x5c);
      auVar14[8] = -(bStack_40 == 0x5c);
      auVar14[9] = -(bStack_3f == 0x5c);
      auVar14[10] = -(bStack_3e == 0x5c);
      auVar14[0xb] = -(bStack_3d == 0x5c);
      auVar14[0xc] = -(bStack_3c == 0x5c);
      auVar14[0xd] = -(bStack_3b == 0x5c);
      auVar14[0xe] = -(bStack_3a == 0x5c);
      auVar14[0xf] = -(bStack_39 == 0x5c);
      auVar13[0] = -((byte)((0x1f < local_48) * '\x1f' | (0x1f >= local_48) * local_48) == local_48)
      ;
      auVar13[1] = -((byte)((0x1f < bStack_47) * '\x1f' | (0x1f >= bStack_47) * bStack_47) ==
                    bStack_47);
      auVar13[2] = -((byte)((0x1f < bStack_46) * '\x1f' | (0x1f >= bStack_46) * bStack_46) ==
                    bStack_46);
      auVar13[3] = -((byte)((0x1f < bStack_45) * '\x1f' | (0x1f >= bStack_45) * bStack_45) ==
                    bStack_45);
      auVar13[4] = -((byte)((0x1f < bStack_44) * '\x1f' | (0x1f >= bStack_44) * bStack_44) ==
                    bStack_44);
      auVar13[5] = -((byte)((0x1f < bStack_43) * '\x1f' | (0x1f >= bStack_43) * bStack_43) ==
                    bStack_43);
      auVar13[6] = -((byte)((0x1f < bStack_42) * '\x1f' | (0x1f >= bStack_42) * bStack_42) ==
                    bStack_42);
      auVar13[7] = -((byte)((0x1f < bStack_41) * '\x1f' | (0x1f >= bStack_41) * bStack_41) ==
                    bStack_41);
      auVar13[8] = -((byte)((0x1f < bStack_40) * '\x1f' | (0x1f >= bStack_40) * bStack_40) ==
                    bStack_40);
      auVar13[9] = -((byte)((0x1f < bStack_3f) * '\x1f' | (0x1f >= bStack_3f) * bStack_3f) ==
                    bStack_3f);
      auVar13[10] = -((byte)((0x1f < bStack_3e) * '\x1f' | (0x1f >= bStack_3e) * bStack_3e) ==
                     bStack_3e);
      auVar13[0xb] = -((byte)((0x1f < bStack_3d) * '\x1f' | (0x1f >= bStack_3d) * bStack_3d) ==
                      bStack_3d);
      auVar13[0xc] = -((byte)((0x1f < bStack_3c) * '\x1f' | (0x1f >= bStack_3c) * bStack_3c) ==
                      bStack_3c);
      auVar13[0xd] = -((byte)((0x1f < bStack_3b) * '\x1f' | (0x1f >= bStack_3b) * bStack_3b) ==
                      bStack_3b);
      auVar13[0xe] = -((byte)((0x1f < bStack_3a) * '\x1f' | (0x1f >= bStack_3a) * bStack_3a) ==
                      bStack_3a);
      auVar13[0xf] = -((byte)((0x1f < bStack_39) * '\x1f' | (0x1f >= bStack_39) * bStack_39) ==
                      bStack_39);
      auVar13 = auVar13 | auVar14 | auVar12;
      uVar1 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar13[0xf] >> 7) << 0xf;
      if (uVar1 != 0) break;
      local_78.length_ = local_78.length_ + 0x10;
      pcVar7 = (local_78.stack_)->stackTop_;
      if ((long)(local_78.stack_)->stackEnd_ - (long)pcVar7 < 0x10) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,0x10);
        pcVar7 = pSVar2->stackTop_;
      }
      pSVar2->stackTop_ = pcVar7 + 0x10;
      *(ulong *)pcVar7 =
           CONCAT17(bStack_41,
                    CONCAT16(bStack_42,
                             CONCAT15(bStack_43,
                                      CONCAT14(bStack_44,
                                               CONCAT13(bStack_45,
                                                        CONCAT12(bStack_46,
                                                                 CONCAT11(bStack_47,local_48)))))));
      *(ulong *)(pcVar7 + 8) =
           CONCAT17(bStack_39,
                    CONCAT16(bStack_3a,
                             CONCAT15(bStack_3b,
                                      CONCAT14(bStack_3c,
                                               CONCAT13(bStack_3d,
                                                        CONCAT12(bStack_3e,
                                                                 CONCAT11(bStack_3f,bStack_40)))))))
      ;
      local_48 = pbVar11[0x10];
      bStack_47 = pbVar11[0x11];
      bStack_46 = pbVar11[0x12];
      bStack_45 = pbVar11[0x13];
      bStack_44 = pbVar11[0x14];
      bStack_43 = pbVar11[0x15];
      bStack_42 = pbVar11[0x16];
      bStack_41 = pbVar11[0x17];
      bStack_40 = pbVar11[0x18];
      bStack_3f = pbVar11[0x19];
      bStack_3e = pbVar11[0x1a];
      bStack_3d = pbVar11[0x1b];
      bStack_3c = pbVar11[0x1c];
      bStack_3b = pbVar11[0x1d];
      bStack_3a = pbVar11[0x1e];
      bStack_39 = pbVar11[0x1f];
      pbVar11 = pbVar11 + 0x10;
    }
    uVar4 = 0;
    if (uVar1 != 0) {
      for (; (uVar1 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
      }
    }
    if (uVar4 != 0) {
      count = (ulong)(uVar4 & 0xffff);
      local_78.length_ = local_78.length_ + (uVar4 & 0xffff);
      pcVar7 = (local_78.stack_)->stackTop_;
      if ((long)(local_78.stack_)->stackEnd_ - (long)pcVar7 < (long)count) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,count);
        pcVar7 = pSVar2->stackTop_;
      }
      pSVar2->stackTop_ = pcVar7 + count;
      uVar9 = 0;
      do {
        pcVar7[uVar9] = pbVar11[uVar9];
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
      pbVar11 = pbVar11 + count;
    }
LAB_00141272:
    pSVar2 = local_78.stack_;
    bVar10 = *pbVar11;
    if (bVar10 != 0x5c) {
      if (bVar10 == 0x22) {
        local_68.src_ = (Ch *)(pbVar11 + 1);
        pcVar7 = (local_78.stack_)->stackTop_;
        if ((local_78.stack_)->stackEnd_ == pcVar7 ||
            (long)(local_78.stack_)->stackEnd_ - (long)pcVar7 < 0) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,1);
          pcVar7 = pSVar2->stackTop_;
        }
        length = local_78.length_;
        pSVar2->stackTop_ = pcVar7 + 1;
        *pcVar7 = '\0';
        local_78.length_ = local_78.length_ + 1;
        if (*(int *)(this + 0x30) == 0) {
          pcVar7 = (local_78.stack_)->stackTop_;
          (local_78.stack_)->stackTop_ = pcVar7 + -(ulong)local_78.length_;
          bVar3 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::String(local_50,pcVar7 + -(ulong)local_78.length_,length,true);
          if (!bVar3) {
            *(undefined4 *)(this + 0x30) = 0x10;
            *(long *)(this + 0x38) = (long)local_68.src_ - (long)local_68.head_;
          }
        }
LAB_00141473:
        local_58->src_ = local_68.src_;
        local_58->head_ = local_68.head_;
        return;
      }
      if (bVar10 < 0x20) {
        if (bVar10 == 0) {
          *(undefined4 *)(this + 0x30) = 0xb;
        }
        else {
          *(undefined4 *)(this + 0x30) = 0xc;
        }
        *(long *)(this + 0x38) = (long)pbVar11 - (long)local_68.head_;
        local_68.src_ = (Ch *)pbVar11;
        goto LAB_00141473;
      }
      local_68.src_ = (Ch *)(pbVar11 + 1);
      bVar10 = *pbVar11;
      pbVar8 = (byte *)(local_78.stack_)->stackTop_;
      if ((byte *)(local_78.stack_)->stackEnd_ == pbVar8 ||
          (long)(local_78.stack_)->stackEnd_ - (long)pbVar8 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,1);
        goto LAB_00141329;
      }
LAB_001412b1:
      pSVar2->stackTop_ = (char *)(pbVar8 + 1);
      *pbVar8 = bVar10;
      local_78.length_ = local_78.length_ + 1;
      goto LAB_00141136;
    }
    escapeOffset = (long)pbVar11 - (long)local_68.head_;
    local_68.src_ = (Ch *)(pbVar11 + 1);
    bVar10 = ParseStringToStream<160u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>(rapidjson::GenericStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
             ::escape[pbVar11[1]];
    if (bVar10 != 0) {
      local_68.src_ = (Ch *)(pbVar11 + 2);
      pbVar8 = (byte *)(local_78.stack_)->stackTop_;
      if ((byte *)(local_78.stack_)->stackEnd_ == pbVar8 ||
          (long)(local_78.stack_)->stackEnd_ - (long)pbVar8 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,1);
LAB_00141329:
        pbVar8 = (byte *)pSVar2->stackTop_;
      }
      goto LAB_001412b1;
    }
    if (pbVar11[1] != 0x75) {
      *(undefined4 *)(this + 0x30) = 10;
LAB_001414b5:
      *(size_t *)(this + 0x38) = escapeOffset;
      goto LAB_00141473;
    }
    local_68.src_ = (Ch *)(pbVar11 + 2);
    uVar4 = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                      ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                        *)this,&local_68,escapeOffset);
    if (*(int *)(this + 0x30) != 0) goto LAB_00141473;
    if ((uVar4 & 0xfffffc00) == 0xd800) {
      pbVar8 = (byte *)local_68.src_;
      if ((*local_68.src_ == 0x5c) &&
         (pbVar8 = (byte *)(local_68.src_ + 1), local_68.src_[1] == 0x75)) {
        local_68.src_ = local_68.src_ + 2;
        uVar5 = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                          ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                            *)this,&local_68,escapeOffset);
        if (*(int *)(this + 0x30) != 0) goto LAB_00141473;
        pbVar8 = (byte *)local_68.src_;
        if (0xfffffbff < uVar5 - 0xe000) {
          uVar4 = uVar4 * 0x400 + uVar5 + 0xfca02400;
          goto LAB_0014137a;
        }
      }
      local_68.src_ = (Ch *)pbVar8;
      *(undefined4 *)(this + 0x30) = 9;
      goto LAB_001414b5;
    }
LAB_0014137a:
    UTF8<char>::
    Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
              (&local_78,uVar4);
  } while( true );
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false) {
        internal::StreamLocalCopy<InputStream> copy(is);
        InputStream& s(copy.s);

        RAPIDJSON_ASSERT(s.Peek() == '\"');
        s.Take();  // Skip '\"'

        bool success = false;
        if (parseFlags & kParseInsituFlag) {
            typename InputStream::Ch *head = s.PutBegin();
            ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            size_t length = s.PutEnd(head) - 1;
            RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
            const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
            success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
        }
        else {
            StackStream<typename TargetEncoding::Ch> stackStream(stack_);
            ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
            const typename TargetEncoding::Ch* const str = stackStream.Pop();
            success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
        }
        if (RAPIDJSON_UNLIKELY(!success))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }